

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakeparser.cpp
# Opt level: O0

void __thiscall
QMakeParser::finalizeCond(QMakeParser *this,ushort **tokPtr,ushort *uc,ushort *ptr,int wordCount)

{
  Data *pDVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  BlockScope *tokPtr_00;
  BlockScope *this_00;
  qsizetype qVar5;
  ulong uVar6;
  QMakeParser *in_RCX;
  short *in_RDX;
  QString *in_RSI;
  QMakeParser *in_RDI;
  int in_R8D;
  long in_FS_OFFSET;
  QByteArrayView QVar7;
  QByteArrayView QVar8;
  BlockScope *top_1;
  BlockScope *top;
  ushort *uce;
  uint nlen;
  char *in_stack_00000058;
  QString *in_stack_fffffffffffffee8;
  QMakeParser *in_stack_fffffffffffffef0;
  QMakeParser *in_stack_ffffffffffffff00;
  QMakeParser *this_01;
  storage_type *local_58;
  undefined1 local_48 [24];
  storage_type *local_30;
  undefined1 local_20 [24];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_R8D == 1) {
    if (*in_RDX == 9) {
      uVar3 = (uint)(ushort)in_RDX[3];
      this_01 = (QMakeParser *)(in_RDX + (ulong)uVar3 + 4);
      if (this_01 == in_RCX) {
        QString::setRawData((QChar *)&in_RDI->m_tmp,(longlong)(in_RDX + 4));
        iVar4 = QString::compare((QString *)&in_RDI->m_tmp,0x3bd8a8);
        if (iVar4 == 0) {
          bVar2 = failOperator(in_stack_ffffffffffffff00,in_stack_00000058);
          if (!bVar2) {
            tokPtr_00 = QStack<QMakeParser::BlockScope>::top
                                  ((QStack<QMakeParser::BlockScope> *)0x3142dd);
            if (((in_RDI->m_canElse & 1U) == 0) ||
               (((tokPtr_00->special & 1U) != 0 && (tokPtr_00->braceLevel == 0)))) {
              while( true ) {
                this_00 = QStack<QMakeParser::BlockScope>::top
                                    ((QStack<QMakeParser::BlockScope> *)0x3143ee);
                if (((this_00->inBranch & 1U) != 0) &&
                   (((this_00->special & 1U) == 0 || (this_00->braceLevel != 0)))) {
                  this_00->inBranch = false;
                  enterScope(in_RCX,(ushort **)CONCAT44(in_R8D,uVar3),
                             SUB81((ulong)this_01 >> 0x38,0),(ScopeState)this_01);
                  goto LAB_00314578;
                }
                if ((this_00->braceLevel != 0) ||
                   (qVar5 = QList<QMakeParser::BlockScope>::size
                                      (&(in_RDI->m_blockstack).super_QList<QMakeParser::BlockScope>)
                   , qVar5 == 1)) break;
                leaveScope(this_01,&tokPtr_00->start);
              }
              QByteArrayView::QByteArrayView<19ul>((QByteArrayView *)this_00,(char (*) [19])in_RDI);
              QVar8.m_data = local_58;
              QVar8.m_size = (qsizetype)local_48;
              QString::fromLatin1(QVar8);
              parseError(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
              QString::~QString((QString *)0x3144bd);
            }
            else {
              pDVar1 = (in_RSI->d).d;
              (in_RSI->d).d =
                   (Data *)((long)&(pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>
                                   ._M_i + 2);
              *(undefined2 *)&(pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                   = 0x18;
              pDVar1 = (in_RSI->d).d;
              (in_RSI->d).d =
                   (Data *)((long)&(pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>
                                   ._M_i + 2);
              *(undefined2 *)&(pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                   = 0;
              pDVar1 = (in_RSI->d).d;
              (in_RSI->d).d =
                   (Data *)((long)&(pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>
                                   ._M_i + 2);
              *(undefined2 *)&(pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                   = 0;
              enterScope(in_RCX,(ushort **)CONCAT44(in_R8D,uVar3),SUB81((ulong)this_01 >> 0x38,0),
                         (ScopeState)this_01);
            }
          }
          goto LAB_00314578;
        }
      }
    }
    finalizeTest(in_RDI,(ushort **)in_stack_fffffffffffffef0);
    uVar6 = (long)in_RCX - (long)in_RDX >> 1;
    memcpy((in_RSI->d).d,in_RDX,(ulong)(uint)((int)uVar6 << 1));
    (in_RSI->d).d =
         (Data *)((long)&(((in_RSI->d).d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                         _M_i + (uVar6 & 0xffffffff) * 2);
    pDVar1 = (in_RSI->d).d;
    (in_RSI->d).d =
         (Data *)((long)&(pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 2)
    ;
    *(undefined2 *)&(pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i = 0x10;
  }
  else if (in_R8D != 0) {
    QByteArrayView::QByteArrayView<40ul>
              ((QByteArrayView *)in_stack_ffffffffffffff00,(char (*) [40])in_RDI);
    QVar7.m_data = local_30;
    QVar7.m_size = (qsizetype)local_20;
    QString::fromLatin1(QVar7);
    bogusTest(in_stack_ffffffffffffff00,(ushort **)in_RDI,in_RSI);
    QString::~QString((QString *)0x31421c);
  }
LAB_00314578:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMakeParser::finalizeCond(ushort *&tokPtr, ushort *uc, ushort *ptr, int wordCount)
{
    if (wordCount != 1) {
        if (wordCount)
            bogusTest(tokPtr, fL1S("Extra characters after test expression."));
        return;
    }

    // Check for magic tokens
    if (*uc == TokHashLiteral) {
        uint nlen = uc[3];
        ushort *uce = uc + 4 + nlen;
        if (uce == ptr) {
            m_tmp.setRawData((QChar *)uc + 4, nlen);
            if (!m_tmp.compare(statics.strelse, Qt::CaseInsensitive)) {
                if (failOperator("in front of else"))
                    return;
                BlockScope &top = m_blockstack.top();
                if (m_canElse && (!top.special || top.braceLevel)) {
                    // A list of tests (the last one likely with side effects),
                    // but no assignment, scope, etc.
                    putTok(tokPtr, TokBranch);
                    // Put empty then block
                    putBlockLen(tokPtr, 0);
                    enterScope(tokPtr, false, StCtrl);
                    return;
                }
                forever {
                    BlockScope &top = m_blockstack.top();
                    if (top.inBranch && (!top.special || top.braceLevel)) {
                        top.inBranch = false;
                        enterScope(tokPtr, false, StCtrl);
                        return;
                    }
                    if (top.braceLevel || m_blockstack.size() == 1)
                        break;
                    leaveScope(tokPtr);
                }
                parseError(fL1S("Unexpected 'else'."));
                return;
            }
        }
    }